

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CluSupportSize(word *t,int nVars)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  
  if (nVars < 1) {
    return 0;
  }
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if ((uint)nVars < 7) {
    uVar1 = 1;
  }
  uVar4 = 0;
  iVar2 = 0;
LAB_004156d2:
  if (uVar4 < 6) {
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        if ((t[uVar9] & ~Truth6[uVar4]) !=
            (t[uVar9] & Truth6[uVar4]) >> ((byte)(1 << ((byte)uVar4 & 0x1f)) & 0x3f))
        goto LAB_00415779;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  else if (0 < (int)uVar1) {
    bVar3 = (byte)(uVar4 - 6);
    uVar5 = 1 << (bVar3 & 0x1f);
    iVar7 = 2 << (bVar3 & 0x1f);
    uVar9 = 1;
    if (1 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
    }
    pwVar10 = t + (int)uVar5;
    iVar6 = 0;
    pwVar11 = t;
    do {
      if (uVar4 - 6 != 0x1f) {
        uVar8 = 0;
        do {
          if (pwVar11[uVar8] != pwVar10[uVar8]) goto LAB_00415779;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      iVar6 = iVar6 + iVar7;
      pwVar10 = pwVar10 + iVar7;
      pwVar11 = pwVar11 + iVar7;
    } while (iVar6 < (int)uVar1);
  }
  goto LAB_0041577b;
LAB_00415779:
  iVar2 = iVar2 + 1;
LAB_0041577b:
  uVar4 = uVar4 + 1;
  if (uVar4 == (uint)nVars) {
    return iVar2;
  }
  goto LAB_004156d2;
}

Assistant:

int If_CluSupportSize( word * t, int nVars )
{
    int v, SuppSize = 0;
    for ( v = 0; v < nVars; v++ )
        if ( If_CluHasVar( t, nVars, v ) )
            SuppSize++;
    return SuppSize;
}